

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.h
# Opt level: O1

Node<MeshLib::Edge> * __thiscall
AVL::Node<MeshLib::Edge>::find_node(Node<MeshLib::Edge> *this,Edge *inData)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = (inData->key).m_s;
  iVar2 = (inData->key).m_t;
  while( true ) {
    iVar3 = (this->data->key).m_s;
    iVar4 = (this->data->key).m_t;
    if (iVar2 == iVar4 && iVar1 == iVar3) break;
    this = (&this->left)[(iVar4 <= iVar2 || iVar1 != iVar3) && iVar3 <= iVar1];
  }
  return this;
}

Assistant:

Node<T> * find_node (T * inData) 
    {
        if (this == NULL)
            return NULL;

        if ( *inData == *data)
            return this;

        if (*inData < *data)
            return left -> find_node (inData);
        else
            return right -> find_node (inData);
    }